

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ptr.h
# Opt level: O2

void __thiscall MeCab::scoped_string::reset_string(scoped_string *this,string *str)

{
  char *__dest;
  
  __dest = (char *)operator_new__(str->_M_string_length + 1);
  strcpy(__dest,(str->_M_dataplus)._M_p);
  scoped_array<char>::reset(&this->super_scoped_array<char>,__dest);
  return;
}

Assistant:

void reset_string(const std::string &str) {
    char *p = new char[str.size() + 1];
    std::strcpy(p, str.c_str());
    reset(p);
  }